

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::ItemSimilarityRecommender::_InternalParse
          (ItemSimilarityRecommender *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  int iVar2;
  Rep *pRVar3;
  bool bVar4;
  ItemSimilarityRecommender_SimilarItems *obj;
  MessageLite *msg;
  StringVector *msg_00;
  string *psVar5;
  uint uVar6;
  char *field_name;
  char cVar7;
  uint res;
  undefined8 *puVar8;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar9;
  Arena *pAVar10;
  ArenaStringPtr *pAVar11;
  internal *this_00;
  pair<const_char_*,_unsigned_int> pVar12;
  StringPiece str;
  byte *local_70;
  InternalMetadata *local_68;
  ArenaStringPtr *local_60;
  ArenaStringPtr *local_58;
  ArenaStringPtr *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  ArenaStringPtr *local_38;
  
  local_70 = (byte *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_70,ctx->group_depth_);
  if (!bVar4) {
    local_68 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &this->recommendeditemscoreoutputfeaturename_;
    local_40 = &this->recommendeditemlistoutputfeaturename_;
    local_48 = &this->itemexclusioninputfeaturename_;
    local_50 = &this->itemrestrictioninputfeaturename_;
    local_58 = &this->numrecommendationsinputfeaturename_;
    local_60 = &this->iteminputfeaturename_;
    do {
      bVar1 = *local_70;
      res = (uint)bVar1;
      pbVar9 = local_70 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*pbVar9 * 0x80) - 0x80;
        if ((char)*pbVar9 < '\0') {
          pVar12 = google::protobuf::internal::ReadTagFallback((char *)local_70,res);
          pbVar9 = (byte *)pVar12.first;
          res = pVar12.second;
        }
        else {
          pbVar9 = local_70 + 2;
        }
      }
      uVar6 = (res >> 3) - 1;
      local_70 = pbVar9;
      if (0x14 < uVar6) goto switchD_00326766_caseD_4;
      field_name = (char *)((long)&switchD_00326766::switchdataD_003bda1c +
                           (long)(int)(&switchD_00326766::switchdataD_003bda1c)[uVar6]);
      cVar7 = (char)res;
      switch(res >> 3) {
      case 1:
        if (cVar7 != '\n') break;
        local_70 = pbVar9 + -1;
        do {
          local_70 = local_70 + 1;
          pRVar3 = (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_0032679c:
            obj = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
                            ((this->itemitemsimilarities_).super_RepeatedPtrFieldBase.arena_);
            msg = (MessageLite *)
                  google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase,obj);
          }
          else {
            iVar2 = (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar2) goto LAB_0032679c;
            (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
            msg = (MessageLite *)pRVar3->elements[iVar2];
          }
          local_70 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,msg,(char *)local_70);
          if (local_70 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_70 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_70 == 10));
        goto LAB_00326a2d;
      case 2:
        if (cVar7 != '\x12') break;
        msg_00 = this->itemstringids_;
        if (msg_00 == (StringVector *)0x0) {
          pAVar10 = (Arena *)(local_68->ptr_ & 0xfffffffffffffffc);
          if ((local_68->ptr_ & 1U) != 0) {
            pAVar10 = *(Arena **)pAVar10;
          }
          msg_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                             (pAVar10);
          this->itemstringids_ = msg_00;
        }
LAB_00326886:
        local_70 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                     (ctx,&msg_00->super_MessageLite,(char *)local_70);
        goto joined_r0x003269db;
      case 3:
        if (cVar7 == '\x1a') {
          msg_00 = (StringVector *)this->itemint64ids_;
          if (msg_00 == (StringVector *)0x0) {
            pAVar10 = (Arena *)(local_68->ptr_ & 0xfffffffffffffffc);
            if ((local_68->ptr_ & 1U) != 0) {
              pAVar10 = *(Arena **)pAVar10;
            }
            msg_00 = (StringVector *)
                     google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                               (pAVar10);
            this->itemint64ids_ = (Int64Vector *)msg_00;
          }
          goto LAB_00326886;
        }
        break;
      case 10:
        if (cVar7 == 'R') {
          puVar8 = (undefined8 *)(local_68->ptr_ & 0xfffffffffffffffc);
          pAVar11 = local_60;
          if ((local_68->ptr_ & 1U) != 0) {
            puVar8 = (undefined8 *)*puVar8;
          }
LAB_00326992:
          psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(pAVar11,puVar8);
          local_70 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       (psVar5,(char *)local_70,ctx);
          this_00 = (internal *)(psVar5->_M_dataplus)._M_p;
          size = psVar5->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (size,"string length exceeds max size");
          }
LAB_003269c6:
          str.length_ = 0;
          str.ptr_ = (char *)size;
          bVar4 = google::protobuf::internal::VerifyUTF8(this_00,str,field_name);
          if (!bVar4) {
            return (char *)0x0;
          }
          goto joined_r0x003269db;
        }
        break;
      case 0xb:
        if (cVar7 == 'Z') {
          puVar8 = (undefined8 *)(local_68->ptr_ & 0xfffffffffffffffc);
          if ((local_68->ptr_ & 1U) != 0) {
            puVar8 = (undefined8 *)*puVar8;
          }
          psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(local_58,puVar8);
          local_70 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                       (psVar5,(char *)local_70,ctx);
          this_00 = (internal *)(psVar5->_M_dataplus)._M_p;
          size = psVar5->_M_string_length;
          if ((long)size < 0) {
            google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (size,"string length exceeds max size");
          }
          goto LAB_003269c6;
        }
        break;
      case 0xc:
        if (cVar7 == 'b') {
          puVar8 = (undefined8 *)(local_68->ptr_ & 0xfffffffffffffffc);
          pAVar11 = local_50;
          if ((local_68->ptr_ & 1U) != 0) {
            puVar8 = (undefined8 *)*puVar8;
          }
          goto LAB_00326992;
        }
        break;
      case 0xd:
        if (cVar7 == 'j') {
          puVar8 = (undefined8 *)(local_68->ptr_ & 0xfffffffffffffffc);
          pAVar11 = local_48;
          if ((local_68->ptr_ & 1U) != 0) {
            puVar8 = (undefined8 *)*puVar8;
          }
          goto LAB_00326992;
        }
        break;
      case 0x14:
        if (cVar7 == -0x5e) {
          puVar8 = (undefined8 *)(local_68->ptr_ & 0xfffffffffffffffc);
          pAVar11 = local_40;
          if ((local_68->ptr_ & 1U) != 0) {
            puVar8 = (undefined8 *)*puVar8;
          }
          goto LAB_00326992;
        }
        break;
      case 0x15:
        if (cVar7 == -0x56) {
          puVar8 = (undefined8 *)(local_68->ptr_ & 0xfffffffffffffffc);
          pAVar11 = local_38;
          if ((local_68->ptr_ & 1U) != 0) {
            puVar8 = (undefined8 *)*puVar8;
          }
          goto LAB_00326992;
        }
      }
switchD_00326766_caseD_4:
      if ((res == 0) || ((res & 7) == 4)) {
        if (pbVar9 == (byte *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        return (char *)pbVar9;
      }
      if ((local_68->ptr_ & 1U) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(local_68);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((local_68->ptr_ & 0xfffffffffffffffcU) + 8);
      }
      local_70 = (byte *)google::protobuf::internal::UnknownFieldParse
                                   (res,unknown,(char *)local_70,ctx);
joined_r0x003269db:
      if (local_70 == (byte *)0x0) {
        return (char *)0x0;
      }
LAB_00326a2d:
      bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_70,ctx->group_depth_);
    } while (!bVar4);
  }
  return (char *)local_70;
}

Assistant:

const char* ItemSimilarityRecommender::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.ItemSimilarityRecommender.SimilarItems itemItemSimilarities = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_itemitemsimilarities(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringVector itemStringIds = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_itemstringids(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector itemInt64Ids = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_itemint64ids(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string itemInputFeatureName = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_iteminputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string numRecommendationsInputFeatureName = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 90)) {
          auto str = _internal_mutable_numrecommendationsinputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string itemRestrictionInputFeatureName = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 98)) {
          auto str = _internal_mutable_itemrestrictioninputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string itemExclusionInputFeatureName = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 106)) {
          auto str = _internal_mutable_itemexclusioninputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string recommendedItemListOutputFeatureName = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          auto str = _internal_mutable_recommendeditemlistoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string recommendedItemScoreOutputFeatureName = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          auto str = _internal_mutable_recommendeditemscoreoutputfeaturename();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}